

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

nn_transport * nn_global_transport(int id)

{
  nn_transport *pnVar1;
  int i;
  nn_transport *tp;
  int id_local;
  
  i = 0;
  while( true ) {
    pnVar1 = nn_transports[i];
    if (pnVar1 == (nn_transport *)0x0) {
      return (nn_transport *)0x0;
    }
    if (pnVar1->id == id) break;
    i = i + 1;
  }
  return pnVar1;
}

Assistant:

const struct nn_transport *nn_global_transport (int id)
{
    const struct nn_transport *tp;
    int i;

    for (i = 0; (tp = nn_transports[i]) != NULL; i++) {
        if (tp->id == id)
            return tp;
    }
    return NULL;
}